

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::EndMenuBar(void)

{
  float fVar1;
  ImGuiWindow *this;
  value_type *pvVar2;
  ImRect IVar3;
  float local_20;
  ImGuiWindow *window;
  
  this = GetCurrentWindow();
  if ((this->SkipItems & 1U) == 0) {
    if ((this->Flags & 0x400U) == 0) {
      __assert_fail("window->Flags & ImGuiWindowFlags_MenuBar",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui.cpp"
                    ,0x2245,"void ImGui::EndMenuBar()");
    }
    if (((this->DC).MenuBarAppending & 1U) == 0) {
      __assert_fail("window->DC.MenuBarAppending",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui.cpp"
                    ,0x2246,"void ImGui::EndMenuBar()");
    }
    PopClipRect();
    PopID();
    fVar1 = (this->DC).CursorPos.x;
    IVar3 = ImGuiWindow::MenuBarRect(this);
    local_20 = IVar3.Min.x;
    (this->DC).MenuBarOffsetX = fVar1 - local_20;
    pvVar2 = ImVector<ImGuiGroupData>::back(&(this->DC).GroupStack);
    pvVar2->AdvanceCursor = false;
    EndGroup();
    (this->DC).LayoutType = 0;
    (this->DC).MenuBarAppending = false;
  }
  return;
}

Assistant:

void ImGui::EndMenuBar()
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return;

    IM_ASSERT(window->Flags & ImGuiWindowFlags_MenuBar);
    IM_ASSERT(window->DC.MenuBarAppending);
    PopClipRect();
    PopID();
    window->DC.MenuBarOffsetX = window->DC.CursorPos.x - window->MenuBarRect().Min.x;
    window->DC.GroupStack.back().AdvanceCursor = false;
    EndGroup();
    window->DC.LayoutType = ImGuiLayoutType_Vertical;
    window->DC.MenuBarAppending = false;
}